

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles3::Functional::CompressedCubeFormatCase::testFace
          (CompressedCubeFormatCase *this,CubeFace face)

{
  ostringstream *this_00;
  RenderContext *context;
  TextureCube *pTVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar8;
  undefined4 extraout_var_02;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  RandomViewport viewport;
  vector<float,_std::allocator<float>_> texCoord;
  Surface renderedFrame;
  Surface referenceFrame;
  TextureFormatInfo spec;
  RandomViewport local_318;
  vector<float,_std::allocator<float>_> local_308;
  TextureFormat local_2f0;
  Surface local_2e8;
  ulong local_2d0;
  Surface local_2c8;
  SurfaceAccess local_2b0;
  ReferenceParams local_28c;
  TextureFormatInfo local_1f8;
  undefined1 local_1b8 [16];
  ConstPixelBufferAccess *local_1a8;
  ConstPixelBufferAccess *pCStack_1a0;
  ConstPixelBufferAccess *local_198;
  ConstPixelBufferAccess *pCStack_190;
  ConstPixelBufferAccess *local_188;
  ios_base local_140 [272];
  long lVar7;
  undefined4 extraout_var_01;
  
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  local_2f0 = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar4 = (this->m_texture->m_refTexture).m_size;
  dVar6 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  local_2d0 = (ulong)face;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_318,(RenderTarget *)CONCAT44(extraout_var_00,iVar5),iVar4,iVar4,dVar6 + face);
  tcu::Surface::Surface(&local_2e8,local_318.width,local_318.height);
  tcu::Surface::Surface(&local_2c8,local_318.width,local_318.height);
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  lVar8 = CONCAT44(extraout_var_01,iVar4);
  bVar10 = 8 - *(char *)(lVar8 + 8);
  uVar12 = 0;
  if (0 < *(int *)(lVar8 + 0x14)) {
    uVar12 = 0x1000000 << (8U - (char)*(int *)(lVar8 + 0x14) & 0x1f);
  }
  uVar9 = 0x100 << (8U - *(char *)(lVar8 + 0xc) & 0x1f) | 1 << (bVar10 & 0x1f);
  uVar12 = 0x10000 << (8U - *(char *)(lVar8 + 0x10) & 0x1f) | uVar9 | uVar12;
  uVar11 = 1 << (bVar10 & 0x1f) & 0xff;
  if (0xfd < uVar11) {
    uVar11 = 0xfe;
  }
  uVar9 = uVar9 >> 8 & 0xff;
  if (0xfd < uVar9) {
    uVar9 = 0xfe;
  }
  uVar13 = uVar12 >> 0x10 & 0xff;
  if (0xfd < uVar13) {
    uVar13 = 0xfe;
  }
  uVar12 = uVar12 >> 0x18;
  if (0xfd < uVar12) {
    uVar12 = 0xfe;
  }
  local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&local_28c,TEXTURETYPE_CUBE);
  uVar2 = local_2d0;
  tcu::getTextureFormatInfo(&local_1f8,&(this->m_texture->m_refTexture).m_format);
  local_28c.super_RenderParams.samplerType =
       glu::TextureTestUtil::getSamplerType((this->m_texture->m_refTexture).m_format);
  local_28c.sampler.wrapS = CLAMP_TO_EDGE;
  local_28c.sampler.wrapT = CLAMP_TO_EDGE;
  local_28c.sampler.wrapR = CLAMP_TO_EDGE;
  local_28c.sampler.minFilter = NEAREST;
  local_28c.sampler.magFilter = NEAREST;
  local_28c.sampler.lodThreshold = 0.0;
  local_28c.sampler.normalizedCoords = true;
  local_28c.sampler.borderColor.v._8_8_ = 0;
  local_28c.sampler.compare = COMPAREMODE_NONE;
  local_28c.sampler.compareChannel = 0;
  local_28c.sampler.borderColor.v._0_8_ = 0;
  local_28c.sampler.seamlessCubeMap = true;
  local_28c.sampler._53_3_ = 0;
  local_28c.sampler.depthStencilMode = MODE_DEPTH;
  local_28c.super_RenderParams.colorScale.m_data[0] = local_1f8.lookupScale.m_data[0];
  local_28c.super_RenderParams.colorScale.m_data[1] = local_1f8.lookupScale.m_data[1];
  local_28c.super_RenderParams.colorScale.m_data[2] = local_1f8.lookupScale.m_data[2];
  local_28c.super_RenderParams.colorScale.m_data[3] = local_1f8.lookupScale.m_data[3];
  local_28c.super_RenderParams.colorBias.m_data[0] = local_1f8.lookupBias.m_data[0];
  local_28c.super_RenderParams.colorBias.m_data[1] = local_1f8.lookupBias.m_data[1];
  local_28c.super_RenderParams.colorBias.m_data[2] = local_1f8.lookupBias.m_data[2];
  local_28c.super_RenderParams.colorBias.m_data[3] = local_1f8.lookupBias.m_data[3];
  glu::TextureTestUtil::computeQuadTexCoordCube(&local_308,(CubeFace)uVar2);
  this_00 = (ostringstream *)(local_1b8 + 8);
  local_1b8._0_4_ = local_2f0.order;
  local_1b8._4_4_ = local_2f0.type;
  std::__cxx11::ostringstream::ostringstream(this_00);
  tcu::operator<<((ostream *)this_00,(CubeFace)uVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_140);
  (**(code **)(lVar7 + 0x1a00))(local_318.x,local_318.y,local_318.width,local_318.height);
  (**(code **)(lVar7 + 8))(0x84c0);
  (**(code **)(lVar7 + 0xb8))(0x8513,this->m_texture->m_glTexture);
  (**(code **)(lVar7 + 0x1360))(0x8513,0x2802,0x812f);
  (**(code **)(lVar7 + 0x1360))(0x8513,0x2803,0x812f);
  (**(code **)(lVar7 + 0x1360))(0x8513,0x2801,0x2600);
  (**(code **)(lVar7 + 0x1360))(0x8513,0x2800,0x2600);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureFormatTests.cpp"
                  ,0x3df);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,
             local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&local_28c.super_RenderParams);
  context = this->m_renderCtx;
  local_2b0.m_surface = (Surface *)0x300000008;
  if ((void *)local_2e8.m_pixels.m_cap != (void *)0x0) {
    local_2e8.m_pixels.m_cap = (size_t)local_2e8.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b8,(TextureFormat *)&local_2b0,local_2e8.m_width,
             local_2e8.m_height,1,(void *)local_2e8.m_pixels.m_cap);
  glu::readPixels(context,local_318.x,local_318.y,(PixelBufferAccess *)local_1b8);
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  tcu::SurfaceAccess::SurfaceAccess
            (&local_2b0,&local_2c8,(PixelFormat *)(CONCAT44(extraout_var_02,iVar4) + 8));
  pTVar1 = this->m_texture;
  local_188 = (pTVar1->m_refTexture).m_view.m_levels[5];
  local_1b8._0_4_ = (pTVar1->m_refTexture).m_view.m_numLevels;
  local_1b8._4_4_ = *(undefined4 *)&(pTVar1->m_refTexture).m_view.field_0x4;
  local_1b8._8_8_ = (pTVar1->m_refTexture).m_view.m_levels[0];
  local_1a8 = (pTVar1->m_refTexture).m_view.m_levels[1];
  pCStack_1a0 = (pTVar1->m_refTexture).m_view.m_levels[2];
  local_198 = (pTVar1->m_refTexture).m_view.m_levels[3];
  pCStack_190 = (pTVar1->m_refTexture).m_view.m_levels[4];
  glu::TextureTestUtil::sampleTexture
            (&local_2b0,(TextureCubeView *)local_1b8,
             local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&local_28c);
  bVar3 = glu::TextureTestUtil::compareImages
                    ((TestLog *)local_2f0,&local_2c8,&local_2e8,
                     (RGBA)(uVar12 * 0x1000000 + (uVar13 << 0x10 | uVar9 * 0x100 + uVar11) +
                           0x1010101));
  if (local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_2c8);
  tcu::Surface::~Surface(&local_2e8);
  return bVar3;
}

Assistant:

bool CompressedCubeFormatCase::testFace (tcu::CubeFace face)
{
	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	TestLog&				log					= m_testCtx.getLog();
	RandomViewport			viewport			(m_renderCtx.getRenderTarget(), m_texture->getRefTexture().getSize(), m_texture->getRefTexture().getSize(), deStringHash(getName())+(deUint32)face);
	tcu::Surface			renderedFrame		(viewport.width, viewport.height);
	tcu::Surface			referenceFrame		(viewport.width, viewport.height);
	tcu::RGBA				threshold			= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
	vector<float>			texCoord;
	ReferenceParams			renderParams		(TEXTURETYPE_CUBE);
	tcu::TextureFormatInfo	spec				= tcu::getTextureFormatInfo(m_texture->getRefTexture().getFormat());

	renderParams.samplerType				= getSamplerType(m_texture->getRefTexture().getFormat());
	renderParams.sampler					= Sampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::NEAREST, Sampler::NEAREST);
	renderParams.sampler.seamlessCubeMap	= true;
	renderParams.colorScale					= spec.lookupScale;
	renderParams.colorBias					= spec.lookupBias;

	computeQuadTexCoordCube(texCoord, face);

	log << TestLog::Message << face << TestLog::EndMessage;

	// Setup base viewport.
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Bind to unit 0.
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_texture->getGLTexture());

	// Setup nearest neighbor filtering and clamp-to-edge.
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_NEAREST);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texturing state");

	m_renderer.renderQuad(0, &texCoord[0], renderParams);
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

	// Compute reference.
	sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat()), m_texture->getRefTexture(), &texCoord[0], renderParams);

	// Compare and log.
	return compareImages(log, referenceFrame, renderedFrame, threshold);
}